

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

void helics::loadOptions<toml::basic_value<toml::type_config>>
               (MessageFederate *fed,basic_value<toml::type_config> *data,Endpoint *ept)

{
  string_view info_00;
  string_view target;
  string_view defVal;
  string_view defVal_00;
  bool bVar1;
  undefined8 in_RDX;
  basic_value<toml::type_config> *in_RSI;
  undefined8 in_RDI;
  string defTarget;
  string info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b0;
  basic_value<toml::type_config> *pbVar2;
  anon_class_1_0_00000001 *in_stack_fffffffffffff9b8;
  Interface *in_stack_fffffffffffff9c0;
  basic_value<toml::type_config> *pbVar3;
  size_t in_stack_fffffffffffff9c8;
  allocator<char> *paVar4;
  string *in_stack_fffffffffffff9d0;
  basic_value<toml::type_config> *pbVar5;
  value *in_stack_fffffffffffff9d8;
  value *element;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffff9e0;
  allocator<char> *__a;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffff9e8;
  value *in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *name1;
  anon_class_8_1_ba1d4489 callback;
  allocator<char> local_4e9 [33];
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  allocator<char> local_4a9 [25];
  string *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb78;
  value *in_stack_fffffffffffffb80;
  allocator<char> local_459 [48];
  allocator<char> local_429;
  undefined8 in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  anon_class_16_2_44194f65 in_stack_fffffffffffffbe8;
  allocator<char> local_401;
  string *in_stack_fffffffffffffc00;
  value *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  allocator<char> local_3d1 [40];
  allocator<char> local_3a9;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffffc58;
  value *in_stack_fffffffffffffc60;
  allocator<char> local_379 [40];
  allocator<char> local_351 [33];
  undefined8 local_330;
  allocator<char> local_321 [40];
  allocator<char> local_2f9 [33];
  undefined8 local_2d8;
  allocator<char> local_2c9 [40];
  allocator<char> local_2a1 [33];
  undefined8 local_280;
  allocator<char> local_271 [40];
  allocator<char> local_249 [33];
  undefined8 local_228;
  allocator<char> local_219 [40];
  allocator<char> local_1f1 [33];
  undefined8 local_1d0;
  allocator<char> local_1c1 [33];
  undefined8 local_1a0;
  string local_191;
  undefined8 local_170;
  undefined1 local_168 [56];
  MessageFederate *pMStack_130;
  allocator<char> local_119 [65];
  undefined8 local_d8;
  undefined8 local_60;
  undefined8 local_58;
  allocator<char> local_39 [33];
  undefined8 local_18;
  basic_value<toml::type_config> *local_10;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  local_60 = local_18;
  local_58 = local_8;
  addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::__cxx11::string_const&)_1_>
            ((value *)in_stack_fffffffffffffbe0,(string *)in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_39);
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::__cxx11::string_const&)_2_,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::__cxx11::string_const&)_3_,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  local_d8 = local_18;
  std::function<void(int,int)>::
  function<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(int,int)_1_,void>
            ((function<void_(int,_int)> *)in_stack_fffffffffffff9c0,
             (anon_class_8_1_ba1d4489 *)in_stack_fffffffffffff9b8);
  processOptions(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                 (function<void_(int,_int)> *)in_stack_fffffffffffff9d8);
  std::function<void_(int,_int)>::~function((function<void_(int,_int)> *)0x27246e);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x27247b);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x272488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  local_168._48_8_ = 0;
  pMStack_130 = (MessageFederate *)0x0;
  defVal._M_str = (char *)in_stack_fffffffffffff9e8;
  defVal._M_len = (size_t)in_stack_fffffffffffff9e0;
  fileops::getOrDefault(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,defVal);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_119);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27252c);
  if (!bVar1) {
    local_168._32_16_ =
         (undefined1  [16])
         std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff9b0);
    info_00._M_str = (char *)in_stack_fffffffffffff9d0;
    info_00._M_len = in_stack_fffffffffffff9c8;
    Interface::setInfo(in_stack_fffffffffffff9c0,info_00);
  }
  local_170 = local_18;
  callback.ept = (Endpoint *)local_168;
  pbVar5 = local_10;
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_fffffffffffff9c0,(anon_class_8_1_ba1d4489 *)in_stack_fffffffffffff9b8);
  loadTags(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x2726d1);
  name1 = &local_191;
  pbVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  local_1a0 = local_18;
  addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_>
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
             (anon_class_8_1_ba1d4489)in_stack_fffffffffffffc10);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  local_1d0 = local_18;
  addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_2_>
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
             (anon_class_8_1_ba1d4489)in_stack_fffffffffffffc10);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  local_228 = local_18;
  addTargetVariations<toml::basic_value<toml::type_config>,helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_3_>
            (pbVar5,name1,(string *)pbVar3,callback);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_219);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  local_280 = local_18;
  addTargetVariations<toml::basic_value<toml::type_config>,helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_4_>
            (pbVar5,name1,(string *)pbVar3,callback);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_271);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  local_2d8 = local_18;
  addTargetVariations<toml::basic_value<toml::type_config>,helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_5_>
            (pbVar5,name1,(string *)pbVar3,callback);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_2c9);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  local_330 = local_18;
  addTargetVariations<toml::basic_value<toml::type_config>,helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_6_>
            (pbVar5,name1,(string *)pbVar3,callback);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_321);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  addTargetVariations<toml::basic_value<toml::type_config>,helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_7_>
            (pbVar5,name1,(string *)pbVar3,callback);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_379);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (allocator<char> *)in_stack_fffffffffffff9e0);
  addTargetVariations<toml::basic_value<toml::type_config>,helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_8_>
            (pbVar5,name1,(string *)pbVar3,callback);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_3d1);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(&local_3a9);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_401;
  pbVar2 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)pbVar2,(allocator<char> *)in_stack_fffffffffffff9e0);
  __a = &local_429;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)pbVar2,__a);
  local_459[0x21] = (allocator<char>)(undefined1)local_18;
  local_459[0x22] = (allocator<char>)local_18._1_1_;
  local_459[0x23] = (allocator<char>)local_18._2_1_;
  local_459[0x24] = (allocator<char>)local_18._3_1_;
  local_459[0x25] = (allocator<char>)local_18._4_1_;
  local_459[0x26] = (allocator<char>)local_18._5_1_;
  local_459[0x27] = (allocator<char>)local_18._6_1_;
  local_459[0x28] = (allocator<char>)local_18._7_1_;
  addTargetVariations<toml::basic_value<toml::type_config>,helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_9_>
            (pbVar5,name1,(string *)pbVar3,callback);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(&local_401);
  element = (value *)local_459;
  pbVar5 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)pbVar2,__a);
  addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_10_>
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
             (anon_class_8_1_ba1d4489)in_stack_fffffffffffffc10);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_459);
  paVar4 = local_4a9;
  pbVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)pbVar2,__a);
  local_4c8 = 0;
  uStack_4c0 = 0;
  defVal_00._M_str = (char *)pbVar2;
  defVal_00._M_len = (size_t)__a;
  fileops::getOrDefault(element,(string *)pbVar5,defVal_00);
  std::__cxx11::string::~string(in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)pbVar2,__a);
  fileops::replaceIfMember
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
  std::allocator<char>::~allocator(local_4e9);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x272f62);
  pbVar2 = local_10;
  if (!bVar1) {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
    target._M_str = (char *)pbVar5;
    target._M_len = (size_t)paVar4;
    Endpoint::setDefaultDestination((Endpoint *)pbVar3,target);
    pbVar2 = local_10;
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2);
  return;
}

Assistant:

static void loadOptions(MessageFederate* fed, const Inp& data, Endpoint& ept)
{
    using fileops::getOrDefault;
    addTargets(data, "flags", [&ept, fed](const std::string& target) {
        auto oindex = getOptionIndex((target.front() != '-') ? target : target.substr(1));
        const int val = (target.front() != '-') ? 1 : 0;
        if (oindex == HELICS_INVALID_OPTION_INDEX) {
            fed->logWarningMessage(target + " is not a recognized flag");
            return;
        }
        ept.setOption(oindex, val);
    });
    processOptions(
        data,
        [](const std::string& option) { return getOptionIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [&ept](int32_t option, int32_t value) { ept.setOption(option, value); });

    auto info = getOrDefault(data, "info", emptyStr);
    if (!info.empty()) {
        ept.setInfo(info);
    }
    loadTags(data, [&ept](std::string_view tagname, std::string_view tagvalue) {
        ept.setTag(tagname, tagvalue);
    });
    addTargets(data, "subscriptions", [&ept](std::string_view sub) { ept.subscribe(sub); });
    addTargets(data, "filters", [&ept](std::string_view filt) { ept.addSourceFilter(filt); });
    addTargetVariations(data, "source", "inputs", [&ept](std::string_view ipt) {
        ept.subscribe(ipt);
    });
    addTargetVariations(data, "source", "filters", [&ept](std::string_view filt) {
        ept.addSourceFilter(filt);
    });
    addTargetVariations(data, "destination", "filters", [&ept](std::string_view filt) {
        ept.addDestinationFilter(filt);
    });
    addTargetVariations(data, "source", "endpoints", [&ept](std::string_view endpoint) {
        ept.addSourceEndpoint(endpoint);
    });
    addTargetVariations(data, "destination", "endpoints", [&ept](std::string_view endpoint) {
        ept.addDestinationEndpoint(endpoint);
    });
    addTargetVariations(data, "source", "targets", [&ept](std::string_view endpoint) {
        ept.addSourceEndpoint(endpoint);
    });
    addTargetVariations(data, "destination", "targets", [&ept](std::string_view endpoint) {
        ept.addDestinationEndpoint(endpoint);
    });
    addTargets(data, "destFilters", [&ept](std::string_view filt) {
        ept.addDestinationFilter(filt);
    });

    auto defTarget = fileops::getOrDefault(data, "target", emptyStr);
    fileops::replaceIfMember(data, "destination", defTarget);
    if (!defTarget.empty()) {
        ept.setDefaultDestination(defTarget);
    }
}